

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O1

void vsencoding::__vseblocks_unpack9(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint32_t uVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  if (0x1f < bs + 0x1f) {
    uVar17 = bs + 0x1f >> 5;
    auVar3 = vpmovsxbd_avx(ZEXT416(0x50e));
    auVar20._8_4_ = 0x1ff;
    auVar20._0_8_ = 0x1ff000001ff;
    auVar20._12_4_ = 0x1ff;
    auVar4 = vpmovsxbd_avx(ZEXT416(0x10a131c));
    auVar5 = vpmovsxbd_avx(ZEXT416(0x3060f18));
    auVar12 = vpmovsxwd_avx(ZEXT816(0x1f801ff01ff0000));
    auVar6 = vpmovsxbd_avx(ZEXT416(0x20b141d));
    auVar7 = vpmovsxbd_avx(ZEXT416(0x2071019));
    auVar13 = vpmovsxwd_avx(ZEXT816(0x1fc01ff01ff0000));
    auVar8 = vpmovsxbd_avx(ZEXT416(0x30c151e));
    auVar9 = vpmovsxbd_avx(ZEXT416(0x108111a));
    auVar14 = vpmovsxwd_avx(ZEXT816(0x1fe01ff01ff0000));
    auVar10 = vpmovsxbd_avx(ZEXT416(0x40d161f));
    auVar11 = vpmovsxbd_avx(ZEXT416(0x912));
    do {
      uVar1 = *in;
      *out = uVar1 >> 0x17;
      auVar18 = vpbroadcastd_avx512vl();
      auVar18 = vpsrlvd_avx2(auVar18,auVar3);
      auVar18 = vpand_avx(auVar18,auVar20);
      *(long *)(out + 1) = auVar18._0_8_;
      uVar16 = (uVar1 & 0x1f) << 4;
      out[3] = uVar16;
      uVar1 = in[1];
      auVar18 = vpbroadcastd_avx512vl();
      auVar21 = vpsrlvd_avx2(auVar18,auVar4);
      auVar18 = vpinsrd_avx(auVar20,uVar16,0);
      auVar19 = vpor_avx(auVar21,auVar18);
      auVar18 = vpand_avx(auVar21,auVar20);
      auVar18 = vpblendd_avx2(auVar18,auVar19,1);
      *(undefined1 (*) [16])(out + 3) = auVar18;
      uVar16 = (uVar1 & 1) << 8;
      out[7] = uVar16;
      uVar1 = in[2];
      auVar18._4_4_ = uVar1;
      auVar18._0_4_ = uVar1;
      auVar18._8_4_ = uVar1;
      auVar18._12_4_ = uVar1;
      auVar19 = vpsrlvd_avx2(auVar18,auVar5);
      auVar18 = vpsllvd_avx2(auVar18,auVar5);
      auVar21 = vpblendd_avx2(auVar19,auVar18,8);
      auVar18 = vpinsrd_avx(auVar12,uVar16,0);
      auVar19 = vpor_avx(auVar19,auVar18);
      auVar18 = vpand_avx(auVar21,auVar12);
      auVar19 = vpblendd_avx2(auVar18,auVar19,1);
      *(undefined1 (*) [16])(out + 7) = auVar19;
      uVar1 = in[3];
      auVar19 = vpbroadcastd_avx512vl();
      auVar21 = vpsrlvd_avx2(auVar19,auVar6);
      auVar18 = vpshufd_avx(auVar18,0xff);
      auVar19 = vpor_avx(auVar21,auVar18);
      auVar18 = vpand_avx(auVar21,auVar20);
      auVar18 = vpblendd_avx2(auVar18,auVar19,1);
      *(undefined1 (*) [16])(out + 10) = auVar18;
      uVar16 = (uVar1 & 3) << 7;
      out[0xe] = uVar16;
      uVar1 = in[4];
      auVar19._4_4_ = uVar1;
      auVar19._0_4_ = uVar1;
      auVar19._8_4_ = uVar1;
      auVar19._12_4_ = uVar1;
      auVar15 = vpsrlvd_avx2(auVar19,auVar7);
      auVar19 = vpsllvd_avx2(auVar19,auVar7);
      auVar18 = vpinsrd_avx(auVar13,uVar16,0);
      auVar21 = vpblendd_avx2(auVar15,auVar19,8);
      auVar19 = vpor_avx(auVar15,auVar18);
      auVar18 = vpand_avx(auVar21,auVar13);
      auVar19 = vpblendd_avx2(auVar18,auVar19,1);
      *(undefined1 (*) [16])(out + 0xe) = auVar19;
      uVar1 = in[5];
      auVar19 = vpbroadcastd_avx512vl();
      auVar21 = vpsrlvd_avx2(auVar19,auVar8);
      auVar18 = vpshufd_avx(auVar18,0xff);
      auVar19 = vpor_avx(auVar21,auVar18);
      auVar18 = vpand_avx(auVar21,auVar20);
      auVar18 = vpblendd_avx2(auVar18,auVar19,1);
      *(undefined1 (*) [16])(out + 0x11) = auVar18;
      uVar16 = (uVar1 & 7) << 6;
      out[0x15] = uVar16;
      uVar1 = in[6];
      auVar21._4_4_ = uVar1;
      auVar21._0_4_ = uVar1;
      auVar21._8_4_ = uVar1;
      auVar21._12_4_ = uVar1;
      auVar19 = vpsrlvd_avx2(auVar21,auVar9);
      auVar18 = vpsllvd_avx2(auVar21,auVar9);
      auVar21 = vpblendd_avx2(auVar19,auVar18,8);
      auVar18 = vpinsrd_avx(auVar14,uVar16,0);
      auVar19 = vpor_avx(auVar19,auVar18);
      auVar18 = vpand_avx(auVar21,auVar14);
      auVar19 = vpblendd_avx2(auVar18,auVar19,1);
      *(undefined1 (*) [16])(out + 0x15) = auVar19;
      uVar1 = in[7];
      auVar19 = vpbroadcastd_avx512vl();
      auVar21 = vpsrlvd_avx2(auVar19,auVar10);
      auVar18 = vpshufd_avx(auVar18,0xff);
      auVar19 = vpor_avx(auVar21,auVar18);
      auVar18 = vpand_avx(auVar21,auVar20);
      auVar18 = vpblendd_avx2(auVar18,auVar19,1);
      *(undefined1 (*) [16])(out + 0x18) = auVar18;
      uVar2 = in[8];
      out[0x1c] = (uVar1 & 0xf) << 5;
      out[0x1c] = (uVar1 & 0xf) << 5 | uVar2 >> 0x1b;
      auVar18 = vpbroadcastd_avx512vl();
      auVar18 = vpsrlvd_avx2(auVar18,auVar11);
      auVar18 = vpand_avx(auVar18,auVar20);
      *(long *)(out + 0x1d) = auVar18._0_8_;
      out[0x1f] = uVar2 & 0x1ff;
      out = out + 0x20;
      in = in + 9;
      uVar17 = uVar17 - 1;
    } while (uVar17 != 0);
  }
  return;
}

Assistant:

void __vseblocks_unpack9(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 9, --bs) {
    out[0] = in[0] >> 23;
    out[1] = (in[0] >> 14) & 0x01ff;
    out[2] = (in[0] >> 5) & 0x01ff;
    out[3] = (in[0] << 4) & 0x01ff;
    out[3] |= in[1] >> 28;
    out[4] = (in[1] >> 19) & 0x01ff;
    out[5] = (in[1] >> 10) & 0x01ff;
    out[6] = (in[1] >> 1) & 0x01ff;
    out[7] = (in[1] << 8) & 0x01ff;
    out[7] |= in[2] >> 24;
    out[8] = (in[2] >> 15) & 0x01ff;
    out[9] = (in[2] >> 6) & 0x01ff;
    out[10] = (in[2] << 3) & 0x01ff;
    out[10] |= in[3] >> 29;
    out[11] = (in[3] >> 20) & 0x01ff;
    out[12] = (in[3] >> 11) & 0x01ff;
    out[13] = (in[3] >> 2) & 0x01ff;
    out[14] = (in[3] << 7) & 0x01ff;
    out[14] |= in[4] >> 25;
    out[15] = (in[4] >> 16) & 0x01ff;
    out[16] = (in[4] >> 7) & 0x01ff;
    out[17] = (in[4] << 2) & 0x01ff;
    out[17] |= in[5] >> 30;
    out[18] = (in[5] >> 21) & 0x01ff;
    out[19] = (in[5] >> 12) & 0x01ff;
    out[20] = (in[5] >> 3) & 0x01ff;
    out[21] = (in[5] << 6) & 0x01ff;
    out[21] |= in[6] >> 26;
    out[22] = (in[6] >> 17) & 0x01ff;
    out[23] = (in[6] >> 8) & 0x01ff;
    out[24] = (in[6] << 1) & 0x01ff;
    out[24] |= in[7] >> 31;
    out[25] = (in[7] >> 22) & 0x01ff;
    out[26] = (in[7] >> 13) & 0x01ff;
    out[27] = (in[7] >> 4) & 0x01ff;
    out[28] = (in[7] << 5) & 0x01ff;
    out[28] |= in[8] >> 27;
    out[29] = (in[8] >> 18) & 0x01ff;
    out[30] = (in[8] >> 9) & 0x01ff;
    out[31] = in[8] & 0x01ff;
  }
}